

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O1

QJsonObject __thiscall PropertyDef::toJson(PropertyDef *this)

{
  storage_type *in_RCX;
  long in_RSI;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QByteArrayView ba_01;
  QByteArrayView ba_02;
  QByteArrayView ba_03;
  QByteArrayView ba_04;
  QByteArrayView ba_05;
  QByteArrayView ba_06;
  QByteArrayView ba_07;
  QLatin1StringView key;
  QLatin1StringView key_00;
  QLatin1StringView key_01;
  QLatin1StringView key_02;
  QLatin1StringView key_03;
  QLatin1StringView key_04;
  QLatin1StringView key_05;
  QLatin1StringView key_06;
  QLatin1StringView key_07;
  QLatin1StringView key_08;
  QLatin1StringView key_09;
  QLatin1StringView key_10;
  QLatin1StringView key_11;
  QLatin1StringView key_12;
  QJsonValueConstRef local_68;
  QString local_58;
  QJsonValue local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (this->name).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QJsonObject::QJsonObject((QJsonObject *)this);
  ba.m_data = in_RCX;
  ba.m_size = *(qsizetype *)(in_RSI + 8);
  QString::fromUtf8(&local_58,*(QString **)(in_RSI + 0x10),ba);
  QJsonValue::QJsonValue(&local_40,&local_58);
  key.m_size = 4;
  key.m_data = "name";
  local_68 = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)this,key);
  QJsonValueRef::operator=((QJsonValueRef *)&local_68,&local_40);
  QJsonValue::~QJsonValue(&local_40);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  ba_00.m_data = in_RCX;
  ba_00.m_size = *(qsizetype *)(in_RSI + 0x20);
  QString::fromUtf8(&local_58,*(QString **)(in_RSI + 0x28),ba_00);
  QJsonValue::QJsonValue(&local_40,&local_58);
  key_00.m_size = 4;
  key_00.m_data = "type";
  local_68 = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)this,key_00);
  QJsonValueRef::operator=((QJsonValueRef *)&local_68,&local_40);
  QJsonValue::~QJsonValue(&local_40);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(QString **)(in_RSI + 0x40) != (QString *)0x0) {
    ba_01.m_data = in_RCX;
    ba_01.m_size = *(qsizetype *)(in_RSI + 0x38);
    QString::fromUtf8(&local_58,*(QString **)(in_RSI + 0x40),ba_01);
    QJsonValue::QJsonValue(&local_40,&local_58);
    key_01.m_size = 6;
    key_01.m_data = "member";
    local_68 = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)this,key_01);
    QJsonValueRef::operator=((QJsonValueRef *)&local_68,&local_40);
    QJsonValue::~QJsonValue(&local_40);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(QString **)(in_RSI + 0x58) != (QString *)0x0) {
    ba_02.m_data = in_RCX;
    ba_02.m_size = *(qsizetype *)(in_RSI + 0x50);
    QString::fromUtf8(&local_58,*(QString **)(in_RSI + 0x58),ba_02);
    QJsonValue::QJsonValue(&local_40,&local_58);
    key_02.m_size = 4;
    key_02.m_data = "read";
    local_68 = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)this,key_02);
    QJsonValueRef::operator=((QJsonValueRef *)&local_68,&local_40);
    QJsonValue::~QJsonValue(&local_40);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(QString **)(in_RSI + 0x70) != (QString *)0x0) {
    ba_03.m_data = in_RCX;
    ba_03.m_size = *(qsizetype *)(in_RSI + 0x68);
    QString::fromUtf8(&local_58,*(QString **)(in_RSI + 0x70),ba_03);
    QJsonValue::QJsonValue(&local_40,&local_58);
    key_03.m_size = 5;
    key_03.m_data = "write";
    local_68 = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)this,key_03);
    QJsonValueRef::operator=((QJsonValueRef *)&local_68,&local_40);
    QJsonValue::~QJsonValue(&local_40);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(QString **)(in_RSI + 0x88) != (QString *)0x0) {
    ba_04.m_data = in_RCX;
    ba_04.m_size = *(qsizetype *)(in_RSI + 0x80);
    QString::fromUtf8(&local_58,*(QString **)(in_RSI + 0x88),ba_04);
    QJsonValue::QJsonValue(&local_40,&local_58);
    key_04.m_size = 8;
    key_04.m_data = "bindable";
    local_68 = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)this,key_04);
    QJsonValueRef::operator=((QJsonValueRef *)&local_68,&local_40);
    QJsonValue::~QJsonValue(&local_40);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(QString **)(in_RSI + 0xa0) != (QString *)0x0) {
    ba_05.m_data = in_RCX;
    ba_05.m_size = *(qsizetype *)(in_RSI + 0x98);
    QString::fromUtf8(&local_58,*(QString **)(in_RSI + 0xa0),ba_05);
    QJsonValue::QJsonValue(&local_40,&local_58);
    key_05.m_size = 5;
    key_05.m_data = "reset";
    local_68 = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)this,key_05);
    QJsonValueRef::operator=((QJsonValueRef *)&local_68,&local_40);
    QJsonValue::~QJsonValue(&local_40);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(QString **)(in_RSI + 0x118) != (QString *)0x0) {
    ba_06.m_data = in_RCX;
    ba_06.m_size = *(qsizetype *)(in_RSI + 0x110);
    QString::fromUtf8(&local_58,*(QString **)(in_RSI + 0x118),ba_06);
    QJsonValue::QJsonValue(&local_40,&local_58);
    key_06.m_size = 6;
    key_06.m_data = "notify";
    local_68 = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)this,key_06);
    QJsonValueRef::operator=((QJsonValueRef *)&local_68,&local_40);
    QJsonValue::~QJsonValue(&local_40);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(QString **)(in_RSI + 0x130) != (QString *)0x0) {
    ba_07.m_data = in_RCX;
    ba_07.m_size = *(qsizetype *)(in_RSI + 0x128);
    QString::fromUtf8(&local_58,*(QString **)(in_RSI + 0x130),ba_07);
    QJsonValue::QJsonValue(&local_40,&local_58);
    key_07.m_size = 0xc;
    key_07.m_data = "privateClass";
    local_68 = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)this,key_07);
    QJsonValueRef::operator=((QJsonValueRef *)&local_68,&local_40);
    QJsonValue::~QJsonValue(&local_40);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  local_68.d = (QCborContainerPrivate *)this;
  toJson::anon_class_8_1_89905061::operator()
            ((anon_class_8_1_89905061 *)&local_68,"designable",(QByteArray *)(in_RSI + 0xa8));
  toJson::anon_class_8_1_89905061::operator()
            ((anon_class_8_1_89905061 *)&local_68,"scriptable",(QByteArray *)(in_RSI + 0xc0));
  toJson::anon_class_8_1_89905061::operator()
            ((anon_class_8_1_89905061 *)&local_68,"stored",(QByteArray *)(in_RSI + 0xd8));
  toJson::anon_class_8_1_89905061::operator()
            ((anon_class_8_1_89905061 *)&local_68,"user",(QByteArray *)(in_RSI + 0xf0));
  QJsonValue::QJsonValue(&local_40,*(bool *)(in_RSI + 0x148));
  key_08.m_size = 8;
  key_08.m_data = "constant";
  local_58.d._0_16_ = QJsonObject::operator[]((QJsonObject *)this,key_08);
  QJsonValueRef::operator=((QJsonValueRef *)&local_58,&local_40);
  QJsonValue::~QJsonValue(&local_40);
  QJsonValue::QJsonValue(&local_40,*(bool *)(in_RSI + 0x149));
  key_09.m_size = 5;
  key_09.m_data = "final";
  local_58.d._0_16_ = QJsonObject::operator[]((QJsonObject *)this,key_09);
  QJsonValueRef::operator=((QJsonValueRef *)&local_58,&local_40);
  QJsonValue::~QJsonValue(&local_40);
  QJsonValue::QJsonValue(&local_40,*(bool *)(in_RSI + 0x14a));
  key_10.m_size = 8;
  key_10.m_data = "required";
  local_58.d._0_16_ = QJsonObject::operator[]((QJsonObject *)this,key_10);
  QJsonValueRef::operator=((QJsonValueRef *)&local_58,&local_40);
  QJsonValue::~QJsonValue(&local_40);
  QJsonValue::QJsonValue(&local_40,*(int *)(in_RSI + 0x14c));
  key_11.m_size = 5;
  key_11.m_data = "index";
  local_58.d._0_16_ = QJsonObject::operator[]((QJsonObject *)this,key_11);
  QJsonValueRef::operator=((QJsonValueRef *)&local_58,&local_40);
  QJsonValue::~QJsonValue(&local_40);
  if (0 < *(int *)(in_RSI + 0x140)) {
    QJsonValue::QJsonValue(&local_40,*(int *)(in_RSI + 0x140));
    key_12.m_size = 8;
    key_12.m_data = "revision";
    local_58.d._0_16_ = QJsonObject::operator[]((QJsonObject *)this,key_12);
    QJsonValueRef::operator=((QJsonValueRef *)&local_58,&local_40);
    QJsonValue::~QJsonValue(&local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
           (QExplicitlySharedDataPointer<QCborContainerPrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QJsonObject PropertyDef::toJson() const
{
    QJsonObject prop;
    prop["name"_L1] = QString::fromUtf8(name);
    prop["type"_L1] = QString::fromUtf8(type);

    const auto jsonify = [&prop](const char *str, const QByteArray &member) {
        if (!member.isEmpty())
            prop[QLatin1StringView(str)] = QString::fromUtf8(member);
    };

    jsonify("member", member);
    jsonify("read", read);
    jsonify("write", write);
    jsonify("bindable", bind);
    jsonify("reset", reset);
    jsonify("notify", notify);
    jsonify("privateClass", inPrivateClass);

    const auto jsonifyBoolOrString = [&prop](const char *str, const QByteArray &boolOrString) {
        QJsonValue value;
        if (boolOrString == "true")
            value = true;
        else if (boolOrString == "false")
            value = false;
        else
            value = QString::fromUtf8(boolOrString); // function name to query at run-time
        prop[QLatin1StringView(str)] = value;
    };

    jsonifyBoolOrString("designable", designable);
    jsonifyBoolOrString("scriptable", scriptable);
    jsonifyBoolOrString("stored", stored);
    jsonifyBoolOrString("user", user);

    prop["constant"_L1] = constant;
    prop["final"_L1] = final;
    prop["required"_L1] = required;
    prop["index"_L1] = relativeIndex;
    if (revision > 0)
        prop["revision"_L1] = revision;

    return prop;
}